

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::
int_writer<unsigned_int>
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this,back_insert_iterator<fmt::v7::detail::buffer<char>_> output,locale_ref loc,
          uint value,basic_format_specs<char> *s)

{
  bool bVar1;
  char local_39;
  basic_format_specs<char> *s_local;
  uint value_local;
  int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
  *this_local;
  locale_ref loc_local;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> output_local;
  
  (this->out).container = output.container;
  (this->locale).locale_ = loc.locale_;
  this->specs = s;
  this->abs_value = value;
  this->prefix_size = 0;
  bVar1 = is_negative<unsigned_int,_0>(value);
  if (bVar1) {
    this->prefix[0] = '-';
    this->prefix_size = this->prefix_size + 1;
    this->abs_value = -this->abs_value;
  }
  else if ((((byte)this->specs->field_0x9 >> 4 & 7) != 0) &&
          (((byte)this->specs->field_0x9 >> 4 & 7) != 1)) {
    local_39 = '+';
    if (((byte)this->specs->field_0x9 >> 4 & 7) != 2) {
      local_39 = ' ';
    }
    this->prefix[0] = local_39;
    this->prefix_size = this->prefix_size + 1;
  }
  return;
}

Assistant:

int_writer(OutputIt output, locale_ref loc, Int value,
             const basic_format_specs<Char>& s)
      : out(output),
        locale(loc),
        specs(s),
        abs_value(static_cast<UInt>(value)),
        prefix_size(0) {
    static_assert(std::is_same<uint32_or_64_or_128_t<Int>, UInt>::value, "");
    if (is_negative(value)) {
      prefix[0] = '-';
      ++prefix_size;
      abs_value = 0 - abs_value;
    } else if (specs.sign != sign::none && specs.sign != sign::minus) {
      prefix[0] = specs.sign == sign::plus ? '+' : ' ';
      ++prefix_size;
    }
  }